

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::internalBuildTailoring
          (RuleBasedCollator *this,UnicodeString *rules,int32_t strength,
          UColAttributeValue decompositionMode,UParseError *outParseError,UnicodeString *outReason,
          UErrorCode *errorCode)

{
  ushort uVar1;
  CollationTailoring *pCVar2;
  ushort uVar3;
  BundleImporter importer;
  UVersionInfo noVersion;
  UnicodeString local_268;
  CollationBuilder builder;
  
  pCVar2 = CollationRoot::getRoot(errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (outReason != (UnicodeString *)0x0) {
      uVar1 = (outReason->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = 2;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar1 & 0x1e;
      }
      (outReason->fUnion).fStackFields.fLengthAndFlags = uVar3;
    }
    CollationBuilder::CollationBuilder(&builder,pCVar2,errorCode);
    noVersion[0] = '\0';
    noVersion[1] = '\0';
    noVersion[2] = '\0';
    noVersion[3] = '\0';
    importer.super_Importer.super_UObject._vptr_UObject = (Importer)&PTR__Importer_0045b898;
    pCVar2 = CollationBuilder::parseAndBuild
                       (&builder,rules,noVersion,&importer.super_Importer,outParseError,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      Locale::setToBogus(&pCVar2->actualLocale);
      adoptTailoring(this,pCVar2,errorCode);
      if (strength != -1) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,5,(ulong)(uint)strength,errorCode);
      }
      if (decompositionMode != UCOL_DEFAULT) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,4,(ulong)(uint)decompositionMode,errorCode);
      }
    }
    else {
      if (builder.errorReason != (char *)0x0 && outReason != (UnicodeString *)0x0) {
        icu_63::UnicodeString::UnicodeString(&local_268,builder.errorReason,-1,kInvariant);
        icu_63::UnicodeString::moveFrom(outReason,&local_268);
        icu_63::UnicodeString::~UnicodeString(&local_268);
      }
      if (pCVar2 != (CollationTailoring *)0x0) {
        (*(pCVar2->super_SharedObject).super_UObject._vptr_UObject[1])(pCVar2);
      }
    }
    CollationRuleParser::Importer::~Importer(&importer.super_Importer);
    CollationBuilder::~CollationBuilder(&builder);
  }
  return;
}

Assistant:

void
RuleBasedCollator::internalBuildTailoring(const UnicodeString &rules,
                                          int32_t strength,
                                          UColAttributeValue decompositionMode,
                                          UParseError *outParseError, UnicodeString *outReason,
                                          UErrorCode &errorCode) {
    const CollationTailoring *base = CollationRoot::getRoot(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(outReason != NULL) { outReason->remove(); }
    CollationBuilder builder(base, errorCode);
    UVersionInfo noVersion = { 0, 0, 0, 0 };
    BundleImporter importer;
    LocalPointer<CollationTailoring> t(builder.parseAndBuild(rules, noVersion,
                                                             &importer,
                                                             outParseError, errorCode));
    if(U_FAILURE(errorCode)) {
        const char *reason = builder.getErrorReason();
        if(reason != NULL && outReason != NULL) {
            *outReason = UnicodeString(reason, -1, US_INV);
        }
        return;
    }
    t->actualLocale.setToBogus();
    adoptTailoring(t.orphan(), errorCode);
    // Set attributes after building the collator,
    // to keep the default settings consistent with the rule string.
    if(strength != UCOL_DEFAULT) {
        setAttribute(UCOL_STRENGTH, (UColAttributeValue)strength, errorCode);
    }
    if(decompositionMode != UCOL_DEFAULT) {
        setAttribute(UCOL_NORMALIZATION_MODE, decompositionMode, errorCode);
    }
}